

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O0

void __thiscall OutputIterations::~OutputIterations(OutputIterations *this)

{
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  return;
}

Assistant:

OutputIterations() = default;